

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

void restore_monsters(void)

{
  int iVar1;
  wchar_t wVar2;
  monster_conflict *mon_00;
  wchar_t local_20;
  wchar_t status_red;
  wchar_t status;
  wchar_t num_turns;
  monster_conflict *mon;
  wchar_t i;
  
  iVar1 = turn - cave->turn;
  mon._4_4_ = cave_monster_max(cave);
  while (mon._4_4_ = mon._4_4_ + L'\xffffffff', L'\0' < mon._4_4_) {
    mon_00 = cave_monster(cave,mon._4_4_);
    regen_monster(mon_00,iVar1 / 100);
    wVar2 = turn_energy((uint)mon_00->mspeed);
    wVar2 = (iVar1 * wVar2) / (int)(uint)z_info->move_energy;
    if (L'\0' < wVar2) {
      for (local_20 = L'\0'; local_20 < L'\n'; local_20 = local_20 + L'\x01') {
        if (mon_00->m_timed[local_20] != 0) {
          mon_dec_timed((monster *)mon_00,local_20,wVar2,L'\0');
        }
      }
    }
  }
  return;
}

Assistant:

void restore_monsters(void)
{
	int i;
	struct monster *mon;

	/* Get the number of turns that have passed */
	int num_turns = turn - cave->turn;

	/* Process the monsters (backwards) */
	for (i = cave_monster_max(cave) - 1; i >= 1; i--) {
		int status, status_red;

		/* Access the monster */
		mon = cave_monster(cave, i);

		/* Regenerate */
		regen_monster(mon, num_turns / 100);

		/* Handle timed effects */
		status_red = num_turns * turn_energy(mon->mspeed) / z_info->move_energy;
		if (status_red > 0) {
			for (status = 0; status < MON_TMD_MAX; status++) {
				if (mon->m_timed[status]) {
					mon_dec_timed(mon, status, status_red, 0);
				}
			}
		}
	}
}